

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void __thiscall
Connection_twoEncapsulatedChildComponentsWithConnectionsAndMixedInterfaces_Test::
~Connection_twoEncapsulatedChildComponentsWithConnectionsAndMixedInterfaces_Test
          (Connection_twoEncapsulatedChildComponentsWithConnectionsAndMixedInterfaces_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Connection, twoEncapsulatedChildComponentsWithConnectionsAndMixedInterfaces)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent\">\n"
        "    <variable name=\"variable1\" interface=\"private\"/>\n"
        "  </component>\n"
        "  <component name=\"child1\">\n"
        "    <variable name=\"variable2\" interface=\"public\"/>\n"
        "  </component>\n"
        "  <component name=\"child2\">\n"
        "    <variable name=\"variable3\" interface=\"public\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"parent\" component_2=\"child1\">\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"parent\" component_2=\"child2\">\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent\">\n"
        "      <component_ref component=\"child1\"/>\n"
        "      <component_ref component=\"child2\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr parent = libcellml::Component::create();
    libcellml::ComponentPtr child1 = libcellml::Component::create();
    libcellml::ComponentPtr child2 = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();

    parent->setName("parent");
    child1->setName("child1");
    child2->setName("child2");
    v1->setName("variable1");
    v2->setName("variable2");
    v3->setName("variable3");

    m->addComponent(parent);
    parent->addComponent(child1);
    parent->addComponent(child2);
    parent->addVariable(v1);
    child1->addVariable(v2);
    child2->addVariable(v3);
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v1, v3);
    v1->setInterfaceType(libcellml::Variable::InterfaceType::PRIVATE);
    v2->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);
    v3->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}